

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep.c
# Opt level: O0

int ARKStepReInit(void *arkode_mem,ARKRhsFn fe,ARKRhsFn fi,realtype t0,N_Vector y0)

{
  realtype in_RCX;
  long in_RDX;
  long in_RSI;
  ARKodeMem in_XMM0_Qa;
  int retval;
  ARKodeARKStepMem step_mem;
  ARKodeMem ark_mem;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  ARKodeMem in_stack_ffffffffffffffc8;
  uint local_4;
  
  local_4 = arkStep_AccessStepMem
                      (in_stack_ffffffffffffffc8,
                       (char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                       (ARKodeMem *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                       (ARKodeARKStepMem *)0xe8c729);
  if (local_4 == 0) {
    if (in_stack_ffffffffffffffc8->MallocDone == 0) {
      arkProcessError(in_stack_ffffffffffffffc8,-0x17,"ARKode::ARKStep","ARKStepReInit",
                      "Attempt to call before ARKodeInit.");
      local_4 = 0xffffffe9;
    }
    else if ((in_RSI == 0) && (in_RDX == 0)) {
      arkProcessError(in_stack_ffffffffffffffc8,-0x16,"ARKode::ARKStep","ARKStepReInit",
                      "Must specify at least one of fe, fi (both NULL).");
      local_4 = 0xffffffea;
    }
    else if (in_RCX == 0.0) {
      arkProcessError(in_stack_ffffffffffffffc8,-0x16,"ARKode::ARKStep","ARKStepReInit",
                      "y0 = NULL illegal.");
      local_4 = 0xffffffea;
    }
    else {
      *(uint *)(CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0) + 0x18) =
           (uint)(in_RSI != 0);
      *(uint *)(CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0) + 0x1c) =
           (uint)(in_RDX != 0);
      *(long *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0) = in_RSI;
      *(long *)(CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0) + 8) = in_RDX;
      *(undefined8 *)(CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0) + 0xd8) =
           0x3ff0000000000000;
      local_4 = arkInit(in_XMM0_Qa,in_RCX,(N_Vector)in_stack_ffffffffffffffc8,
                        in_stack_ffffffffffffffc4);
      if (local_4 == 0) {
        *(undefined8 *)(CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0) + 0x170) = 0;
        *(undefined8 *)(CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0) + 0x178) = 0;
        *(undefined8 *)(CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0) + 0x180) = 0;
        *(undefined8 *)(CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0) + 0xf0) = 0;
        local_4 = 0;
      }
      else {
        arkProcessError(in_stack_ffffffffffffffc8,(int)(ulong)local_4,"ARKode::ARKStep",
                        "ARKStepReInit","Unable to reinitialize main ARKode infrastructure");
      }
    }
  }
  return local_4;
}

Assistant:

int ARKStepReInit(void* arkode_mem, ARKRhsFn fe,
                  ARKRhsFn fi, realtype t0, N_Vector y0)
{
  ARKodeMem ark_mem;
  ARKodeARKStepMem step_mem;
  int retval;

  /* access ARKodeARKStepMem structure */
  retval = arkStep_AccessStepMem(arkode_mem, "ARKStepReInit",
                                 &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS)  return(retval);

  /* Check if ark_mem was allocated */
  if (ark_mem->MallocDone == SUNFALSE) {
    arkProcessError(ark_mem, ARK_NO_MALLOC, "ARKode::ARKStep",
                    "ARKStepReInit", MSG_ARK_NO_MALLOC);
    return(ARK_NO_MALLOC);
  }

  /* Check that at least one of fe, fi is supplied and is to be used */
  if (fe == NULL && fi == NULL) {
    arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode::ARKStep",
                    "ARKStepReInit", MSG_ARK_NULL_F);
    return(ARK_ILL_INPUT);
  }

  /* Check that y0 is supplied */
  if (y0 == NULL) {
    arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode::ARKStep",
                    "ARKStepReInit", MSG_ARK_NULL_Y0);
    return(ARK_ILL_INPUT);
  }

  /* Set implicit/explicit problem based on function pointers */
  step_mem->explicit = (fe == NULL) ? SUNFALSE : SUNTRUE;
  step_mem->implicit = (fi == NULL) ? SUNFALSE : SUNTRUE;

  /* Copy the input parameters into ARKode state */
  step_mem->fe = fe;
  step_mem->fi = fi;

  /* Initialize initial error norm  */
  step_mem->eRNrm = ONE;

  /* Initialize main ARKode infrastructure */
  retval = arkInit(ark_mem, t0, y0, FIRST_INIT);
  if (retval != ARK_SUCCESS) {
    arkProcessError(ark_mem, retval, "ARKode::ARKStep", "ARKStepReInit",
                    "Unable to reinitialize main ARKode infrastructure");
    return(retval);
  }

  /* Initialize all the counters */
  step_mem->nfe     = 0;
  step_mem->nfi     = 0;
  step_mem->nsetups = 0;
  step_mem->nstlp   = 0;

  return(ARK_SUCCESS);
}